

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int fmt::v8::detail::parse_nonnegative_int<char8_t>(char8_t **begin,char8_t *end,int error_value)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte *pbVar6;
  
  pbVar2 = (byte *)*begin;
  if ((pbVar2 == (byte *)end) || (9 < (byte)(*pbVar2 - 0x30))) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8ca,"");
  }
  uVar3 = 0;
  pbVar4 = pbVar2;
  do {
    pbVar6 = pbVar4 + 1;
    uVar5 = (ulong)uVar3;
    bVar1 = *pbVar4;
    uVar3 = ((uint)bVar1 + uVar3 * 10) - 0x30;
    pbVar4 = (byte *)end;
    if (pbVar6 == (byte *)end) break;
    pbVar4 = pbVar6;
  } while ((byte)(*pbVar6 - 0x30) < 10);
  *begin = (char8_t *)pbVar4;
  if ((9 < (long)pbVar4 - (long)pbVar2) &&
     (((long)pbVar4 - (long)pbVar2 != 10 ||
      (((ulong)(bVar1 - 0x30 & 0xfffffffe) + uVar5 * 10 & 0xffffffff80000000) != 0)))) {
    uVar3 = error_value;
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}